

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CliffordLib.cpp
# Opt level: O0

Clifford * operator^(Clifford *__return_storage_ptr__,Clifford *A,Clifford *B)

{
  float fVar1;
  bool bVar2;
  pointer pBVar3;
  double dVar4;
  Blade local_84;
  int local_7c;
  __normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_> _Stack_78;
  int i_1;
  Blade *local_70;
  float local_58;
  uint local_54;
  float prd;
  int bm;
  __normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_> local_48;
  idx b;
  iterator iStack_38;
  int am;
  __normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_> local_30;
  idx a;
  int i;
  Clifford *B_local;
  Clifford *A_local;
  Clifford *R;
  
  a._M_current._7_1_ = 0;
  std::vector<Blade,_std::allocator<Blade>_>::vector(__return_storage_ptr__);
  for (a._M_current._0_4_ = 0; (int)a._M_current < dim; a._M_current._0_4_ = (int)a._M_current + 1)
  {
    Re[(int)a._M_current] = 0.0;
  }
  local_30._M_current = (Blade *)std::vector<Blade,_std::allocator<Blade>_>::begin(A);
  while( true ) {
    iStack_38 = std::vector<Blade,_std::allocator<Blade>_>::end(A);
    bVar2 = __gnu_cxx::operator!=(&local_30,&stack0xffffffffffffffc8);
    if (!bVar2) break;
    pBVar3 = __gnu_cxx::__normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_>::
             operator->(&local_30);
    b._M_current._4_4_ = pBVar3->mBase;
    local_48._M_current = (Blade *)std::vector<Blade,_std::allocator<Blade>_>::begin(B);
    while( true ) {
      _prd = std::vector<Blade,_std::allocator<Blade>_>::end(B);
      bVar2 = __gnu_cxx::operator!=
                        (&local_48,
                         (__normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_> *)
                         &prd);
      if (!bVar2) break;
      pBVar3 = __gnu_cxx::__normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_>::
               operator->(&local_48);
      local_54 = pBVar3->mBase;
      if ((b._M_current._4_4_ & local_54) == 0) {
        pBVar3 = __gnu_cxx::__normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_>
                 ::operator->(&local_30);
        fVar1 = pBVar3->mVal;
        pBVar3 = __gnu_cxx::__normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_>
                 ::operator->(&local_48);
        local_58 = fVar1 * pBVar3->mVal;
        dVar4 = std::fabs((double)(ulong)(uint)local_58);
        if (1e-06 < SUB84(dVar4,0)) {
          Re[(int)(b._M_current._4_4_ ^ local_54)] =
               (float)signs[(int)b._M_current._4_4_][(int)local_54] * local_58 +
               Re[(int)(b._M_current._4_4_ ^ local_54)];
        }
      }
      local_70 = (Blade *)__gnu_cxx::
                          __normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_>::
                          operator++(&local_48,0);
    }
    _Stack_78 = __gnu_cxx::__normal_iterator<Blade_*,_std::vector<Blade,_std::allocator<Blade>_>_>::
                operator++(&local_30,0);
  }
  for (local_7c = 0; local_7c < dim; local_7c = local_7c + 1) {
    dVar4 = std::fabs((double)(ulong)(uint)Re[local_7c]);
    if (1e-06 < SUB84(dVar4,0)) {
      Blade::Blade(&local_84,local_7c,Re[local_7c]);
      std::vector<Blade,_std::allocator<Blade>_>::push_back(__return_storage_ptr__,&local_84);
      Blade::~Blade(&local_84);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Clifford operator^(Clifford A, Clifford B)
{
   Clifford R; 
   //double *Re=new double[dim];
   for(int i=0;i<dim;i++)Re[i]=0;


   idx a=A.begin();
	while(a!=A.end())
	{
		int am=a->mBase;
		idx b=B.begin();
		while(b!=B.end())
		{	
			int bm=b->mBase;
			
			if((am&bm)==0)
			{
				float prd=(a->mVal)*(b->mVal);
				if(fabs(prd)>Error2)
					Re[am^bm]+=signs[am][bm]*prd;

			}
			b++;
		}
		a++;
	}

	for(int i=0;i<dim;i++)
	{if(fabs(Re[i])>Error2){R.push_back(Blade(i,Re[i]));}}
  //delete Re;
  return R;
}